

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * translate(rpc_conn *conn,string *orignal)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  string *in_RDX;
  string *in_RDI;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  string *temp;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30 [2];
  undefined1 local_19;
  
  local_19 = 0;
  std::__cxx11::string::string(in_RDI,in_RDX);
  local_30[0]._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_RDI,in_stack_ffffffffffffffa8), bVar1) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_30);
    iVar2 = toupper((int)*pcVar3);
    *pcVar3 = (char)iVar2;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_30);
  }
  return in_RDI;
}

Assistant:

std::string translate(rpc_conn conn, const std::string &orignal) {
  std::string temp = orignal;
  for (auto &c : temp) {
    c = std::toupper(c);
  }
  return temp;
}